

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboColorbufferTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::FboColorbufferCase::compare
          (FboColorbufferCase *this,Surface *reference,Surface *result)

{
  bool bVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  ConstPixelBufferAccess local_210;
  ConstPixelBufferAccess local_1e8;
  MessageBuilder local_1b0;
  deUint32 local_2c;
  deUint32 local_28;
  RGBA local_24;
  Surface *pSStack_20;
  RGBA threshold;
  Surface *result_local;
  Surface *reference_local;
  FboColorbufferCase *this_local;
  
  pSStack_20 = result;
  local_28 = (deUint32)FboTestUtil::getFormatThreshold(this->m_format);
  local_2c = MIN_THRESHOLD.m_value;
  local_24 = tcu::max((RGBA)local_28,MIN_THRESHOLD);
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::TestLog::operator<<(&local_1b0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1b0,(char (*) [30])"Comparing images, threshold: ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_24);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_FboTestCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  tcu::Surface::getAccess(&local_1e8,reference);
  tcu::Surface::getAccess(&local_210,pSStack_20);
  bVar1 = tcu::bilinearCompare
                    (pTVar2,"Result","Image comparison result",&local_1e8,&local_210,local_24,
                     COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compare (const tcu::Surface& reference, const tcu::Surface& result)
	{
		const tcu::RGBA threshold (tcu::max(getFormatThreshold(m_format), MIN_THRESHOLD));

		m_testCtx.getLog() << TestLog::Message << "Comparing images, threshold: " << threshold << TestLog::EndMessage;

		return tcu::bilinearCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);
	}